

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int __thiscall despot::Parser::NumInitialStates(Parser *this)

{
  pointer pTVar1;
  pointer pSVar2;
  int iVar3;
  int iVar4;
  int v;
  int iVar5;
  ulong uVar6;
  double dVar7;
  int n;
  
  dVar7 = LogNumInitialStates(this);
  if (dVar7 <= 30.0) {
    pSVar2 = (this->prev_state_vars_).
             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = 1;
    for (uVar6 = 0;
        uVar6 < (ulong)(((long)(this->prev_state_vars_).
                               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0xc0);
        uVar6 = uVar6 + 1) {
      iVar4 = 0;
      for (iVar5 = 0;
          iVar5 < (int)((ulong)((long)*(pointer *)
                                       ((long)&pSVar2[uVar6].super_NamedVar.super_Variable.values_ +
                                       8) -
                               *(long *)&pSVar2[uVar6].super_NamedVar.super_Variable.values_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data) >> 5); iVar5 = iVar5 + 1)
      {
        pTVar1 = (this->initial_belief_funcs_).
                 super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>._M_impl
                 .super__Vector_impl_data._M_start;
        dVar7 = (double)(**(code **)((long)pTVar1[uVar6].super_CPT.super_Function._vptr_Function +
                                    0x20))(pTVar1 + uVar6,0,iVar5);
        iVar4 = iVar4 + (uint)(0.0 < dVar7);
        pSVar2 = (this->prev_state_vars_).
                 super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar3 = iVar3 * iVar4;
    }
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int Parser::NumInitialStates() const {
	if (LogNumInitialStates() > 30) {
		return -1;
	} else {
		int num_states = 1;

		for (int s = 0; s < prev_state_vars_.size(); s++) {
			int n = 0;
			for (int v = 0; v < prev_state_vars_[s].Size(); v++)
				n += (initial_belief_funcs_[s].GetValue(0, v) > 0);
			num_states *= n;
		}

		return num_states;
	}
}